

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O3

ion_err_t oafdict_scan(ion_oafdict_cursor_t *cursor)

{
  ion_dictionary_parent_t *piVar1;
  ion_boolean_t iVar2;
  byte *__ptr;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_t __size;
  
  piVar1 = ((cursor->super).dictionary)->instance;
  uVar5 = (long)(cursor->current + 1) % (long)(int)piVar1[1].key_type;
  iVar3 = (int)uVar5;
  uVar5 = uVar5 & 0xffffffff;
  __size = (long)(piVar1->record).key_size + (long)(piVar1->record).value_size + 1;
  fseek((FILE *)piVar1[1].compare,(long)((int)__size * iVar3),0);
  __ptr = (byte *)malloc(__size);
  if (iVar3 != cursor->first) {
    do {
      fread(__ptr,__size,1,(FILE *)piVar1[1].compare);
      if ((*__ptr < 0xfe) && (iVar2 = test_predicate(&cursor->super,__ptr + 1), iVar2 == '\x01')) {
        cursor->current = (int)uVar5;
        free(__ptr);
        return '\x04';
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      if ((int)piVar1[1].key_type <= (int)uVar4) {
        uVar5 = 0;
      }
    } while ((int)uVar5 != cursor->first);
  }
  free(__ptr);
  return '\x01';
}

Assistant:

ion_err_t
oafdict_scan(
	ion_oafdict_cursor_t *cursor/* don't need to pass in the cursor */
) {
	/* need to scan hashmap fully looking for values that satisfy - need to think about */
	ion_file_hashmap_t *hash_map	= (ion_file_hashmap_t *) (cursor->super.dictionary->instance);

	int loc							= (cursor->current + 1) % hash_map->map_size;
	/* this is the current position of the cursor */
	/* and start scanning 1 ahead */

	int record_size = SIZEOF(STATUS) + hash_map->super.record.key_size + hash_map->super.record.value_size;

	/* move to the correct position in the fie */
	fseek(hash_map->file, loc * record_size, SEEK_SET);

	ion_hash_bucket_t *item;

	item = malloc(record_size);

	/* start at the current position, scan forward */
	while (loc != cursor->first) {
		fread(item, record_size, 1, hash_map->file);

		if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* if empty, just skip to next cell */
			loc++;
		}
		else {
			/* check to see if the current key value satisfies the predicate */

			ion_boolean_t key_satisfies_predicate = test_predicate(&(cursor->super), item->data);	/* assumes that the key is first */

			if (key_satisfies_predicate == boolean_true) {
				cursor->current = loc;	/* this is the next index for value */
				free(item);
				return cs_cursor_active;
			}

			/* If valid bucket is not found, advance current position. */
			loc++;
		}

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
		}
	}

	/* if you end up here, you've wrapped the entire data structure and not found a value */
	free(item);
	return cs_end_of_results;
}